

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

void __thiscall
FPathTraverse::AddThingIntercepts
          (FPathTraverse *this,int bx,int by,FBlockThingsIterator *it,bool compatible)

{
  double *pdVar1;
  bool bVar2;
  intercept_t *piVar3;
  intercept_t *piVar4;
  AActor *pAVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  double den;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double v1dx;
  double v1dy;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  FBlockThingsIterator::SwitchBlock(it,bx,by);
  pAVar5 = FBlockThingsIterator::Next(it,compatible);
  do {
    if (pAVar5 == (AActor *)0x0) {
      return;
    }
    if (compatible) {
      dVar13 = (this->trace).dx;
      dVar9 = (this->trace).dy;
      dVar11 = pAVar5->radius;
      dVar16 = (pAVar5->__Pos).Y;
      dVar15 = dVar11 + dVar16;
      dVar16 = dVar16 - dVar11;
      dVar10 = dVar16;
      if (dVar13 * dVar9 <= 0.0) {
        dVar10 = dVar15;
      }
      dVar12 = (pAVar5->__Pos).X;
      dVar14 = dVar12 - dVar11;
      dVar12 = dVar12 + dVar11;
      uVar8 = -(ulong)(0.0 < dVar13 * dVar9);
      dVar15 = (double)(~uVar8 & (ulong)dVar16 | (ulong)dVar15 & uVar8);
      dVar11 = (this->trace).x;
      dVar16 = (this->trace).y;
      if (1.52587890625e-05 < (dVar11 - dVar14) * dVar9 + (dVar15 - dVar16) * dVar13 ==
          (dVar11 - dVar12) * dVar9 + (dVar10 - dVar16) * dVar13 <= 1.52587890625e-05) {
        dVar12 = dVar12 - dVar14;
        dVar9 = dVar13 * (dVar10 - dVar15) - dVar9 * dVar12;
        dVar13 = 0.0;
        if ((dVar9 != 0.0) || (NAN(dVar9))) {
          dVar13 = (dVar12 * (dVar16 - dVar15) + (dVar10 - dVar15) * (dVar14 - dVar11)) / dVar9;
        }
        if (this->Startfrac <= dVar13) goto LAB_0041b8b3;
      }
    }
    else {
      iVar6 = 0;
      iVar7 = 0;
      do {
        switch(iVar7) {
        case 0:
          dVar13 = pAVar5->radius;
          local_50 = (pAVar5->__Pos).Y + dVar13;
          pdVar1 = &(this->trace).y;
          if (local_50 < *pdVar1 || local_50 == *pdVar1) {
            local_38 = (pAVar5->__Pos).X + dVar13;
            local_40 = dVar13 * -2.0;
LAB_0041b5db:
            local_48 = 0.0;
            goto switchD_0041b570_default;
          }
          break;
        case 1:
          dVar13 = pAVar5->radius;
          local_38 = (pAVar5->__Pos).X + dVar13;
          if (local_38 < (this->trace).x || local_38 == (this->trace).x) {
            local_50 = (pAVar5->__Pos).Y - dVar13;
            local_48 = dVar13 + dVar13;
LAB_0041b650:
            local_40 = 0.0;
            goto switchD_0041b570_default;
          }
          break;
        case 2:
          dVar13 = pAVar5->radius;
          local_50 = (pAVar5->__Pos).Y - dVar13;
          if ((this->trace).y <= local_50) {
            local_38 = (pAVar5->__Pos).X - dVar13;
            local_40 = dVar13 + dVar13;
            goto LAB_0041b5db;
          }
          break;
        case 3:
          dVar13 = pAVar5->radius;
          local_38 = (pAVar5->__Pos).X - dVar13;
          if ((this->trace).x <= local_38) {
            local_50 = (pAVar5->__Pos).Y + dVar13;
            local_48 = dVar13 * -2.0;
            goto LAB_0041b650;
          }
          break;
        default:
switchD_0041b570_default:
          iVar6 = iVar6 + 1;
          dVar13 = (this->trace).x;
          dVar9 = (this->trace).y;
          dVar11 = (this->trace).dx;
          dVar16 = (this->trace).dy;
          if (1.52587890625e-05 < (dVar13 - local_38) * dVar16 + (local_50 - dVar9) * dVar11 ==
              (dVar13 - (local_38 + local_40)) * dVar16 + ((local_50 + local_48) - dVar9) * dVar11
              <= 1.52587890625e-05) {
            dVar11 = dVar11 * local_48 - dVar16 * local_40;
            dVar16 = 0.0;
            if ((dVar11 != 0.0) || (NAN(dVar11))) {
              dVar16 = ((dVar9 - local_50) * local_40 + (local_38 - dVar13) * local_48) / dVar11;
            }
            dVar10 = this->Startfrac;
            if (dVar10 <= dVar16) {
LAB_0041b7df:
              TArray<intercept_t,_intercept_t>::Grow(&intercepts,1);
              piVar4 = intercepts.Array;
              uVar8 = (ulong)intercepts.Count;
              intercepts.Array[uVar8].frac = dVar16;
              piVar3 = piVar4 + uVar8;
              piVar3->isaline = false;
              piVar3->done = false;
              piVar4[uVar8].d.thing = pAVar5;
              intercepts.Count = intercepts.Count + 1;
              bVar2 = false;
            }
            else {
              bVar2 = true;
              if (0.0 < dVar10) {
                switch(iVar7) {
                case 0:
                  local_50 = local_50 - (pAVar5->radius + pAVar5->radius);
                  break;
                case 1:
                  local_38 = local_38 - (pAVar5->radius + pAVar5->radius);
                  break;
                case 2:
                  local_50 = local_50 + pAVar5->radius + pAVar5->radius;
                  break;
                case 3:
                  local_38 = local_38 + pAVar5->radius + pAVar5->radius;
                }
                dVar15 = 0.0;
                if ((dVar11 != 0.0) || (NAN(dVar11))) {
                  dVar15 = ((dVar9 - local_50) * local_40 + (local_38 - dVar13) * local_48) / dVar11
                  ;
                }
                if (dVar10 <= dVar15) goto LAB_0041b7df;
              }
            }
            if (!bVar2) goto LAB_0041b878;
          }
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != 4);
LAB_0041b878:
      if (iVar6 == 0) {
        dVar13 = 0.0;
LAB_0041b8b3:
        TArray<intercept_t,_intercept_t>::Grow(&intercepts,1);
        piVar4 = intercepts.Array;
        uVar8 = (ulong)intercepts.Count;
        intercepts.Array[uVar8].frac = dVar13;
        piVar3 = piVar4 + uVar8;
        piVar3->isaline = false;
        piVar3->done = false;
        piVar4[uVar8].d.thing = pAVar5;
        intercepts.Count = intercepts.Count + 1;
      }
    }
    pAVar5 = FBlockThingsIterator::Next(it,compatible);
  } while( true );
}

Assistant:

void FPathTraverse::AddThingIntercepts (int bx, int by, FBlockThingsIterator &it, bool compatible)
{
	AActor *thing;

	it.SwitchBlock(bx, by);
	while ((thing = it.Next(compatible)))
	{
		int numfronts = 0;
		divline_t line;
		int i;


		if (!compatible)
		{
			// [RH] Don't check a corner to corner crossection for hit.
			// Instead, check against the actual bounding box (but not if compatibility optioned.)

			// There's probably a smarter way to determine which two sides
			// of the thing face the trace than by trying all four sides...
			for (i = 0; i < 4; ++i)
			{
				switch (i)
				{
				case 0:		// Top edge
					line.y = thing->Y() + thing->radius;
					if (trace.y < line.y) continue;
					line.x = thing->X() + thing->radius;
					line.dx = -thing->radius * 2;
					line.dy = 0;
					break;

				case 1:		// Right edge
					line.x = thing->X() + thing->radius;
					if (trace.x < line.x) continue;
					line.y = thing->Y() - thing->radius;
					line.dx = 0;
					line.dy = thing->radius * 2;
					break;

				case 2:		// Bottom edge
					line.y = thing->Y() - thing->radius;
					if (trace.y > line.y) continue;
					line.x = thing->X() - thing->radius;
					line.dx = thing->radius * 2;
					line.dy = 0;
					break;

				case 3:		// Left edge
					line.x = thing->X() - thing->radius;
					if (trace.x > line.x) continue;
					line.y = thing->Y() + thing->radius;
					line.dx = 0;
					line.dy = thing->radius * -2;
					break;
				}
				// Check if this side is facing the trace origin
				numfronts++;

				// If it is, see if the trace crosses it
				if (P_PointOnDivlineSide (line.x, line.y, &trace) !=
					P_PointOnDivlineSide (line.x + line.dx, line.y + line.dy, &trace))
				{
					// It's a hit
					double frac = P_InterceptVector (&trace, &line);
					if (frac < Startfrac)
					{ // behind source
						if (Startfrac > 0)
						{
							// check if the trace starts within this actor
							switch (i)
							{
							case 0:
								line.y -= 2 * thing->radius;
								break;

							case 1:
								line.x -= 2 * thing->radius;
								break;

							case 2:
								line.y += 2 * thing->radius;
								break;

							case 3:
								line.x += 2 * thing->radius;
								break;
							}
							double frac2 = P_InterceptVector(&trace, &line);
							if (frac2 >= Startfrac) goto addit;
						}
						continue;
					}
				addit:
					intercept_t newintercept;
					newintercept.frac = frac;
					newintercept.isaline = false;
					newintercept.done = false;
					newintercept.d.thing = thing;
					intercepts.Push (newintercept);
					break;
				}
			}

			// If none of the sides was facing the trace, then the trace
			// must have started inside the box, so add it as an intercept.
			if (numfronts == 0)
			{
				intercept_t newintercept;
				newintercept.frac = 0;
				newintercept.isaline = false;
				newintercept.done = false;
				newintercept.d.thing = thing;
				intercepts.Push (newintercept);
			}
		}
		else
		{
			// Old code for compatibility purposes
			double 		x1, y1, x2, y2;
			int 			s1, s2;
			divline_t		dl;
			double 		frac;
				
			bool tracepositive = (trace.dx * trace.dy)>0;
						
			// check a corner to corner crossection for hit
			if (tracepositive)
			{
				x1 = thing->X() - thing->radius;
				y1 = thing->Y() + thing->radius;
						
				x2 = thing->X() + thing->radius;
				y2 = thing->Y() - thing->radius;					
			}
			else
			{
				x1 = thing->X() - thing->radius;
				y1 = thing->Y() - thing->radius;
						
				x2 = thing->X() + thing->radius;
				y2 = thing->Y() + thing->radius;					
			}
			
			s1 = P_PointOnDivlineSide (x1, y1, &trace);
			s2 = P_PointOnDivlineSide (x2, y2, &trace);

			if (s1 != s2)
			{
				dl.x = x1;
				dl.y = y1;
				dl.dx = x2-x1;
				dl.dy = y2-y1;
				
				frac = P_InterceptVector (&trace, &dl);

				if (frac >= Startfrac)
				{
					intercept_t newintercept;
					newintercept.frac = frac;
					newintercept.isaline = false;
					newintercept.done = false;
					newintercept.d.thing = thing;
					intercepts.Push (newintercept);
				}
			}
		}
	}
}